

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
          (arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this,handle handle)

{
  iterator iVar1;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *this_local;
  handle handle_local;
  
  handle_local.custom_.value = handle.custom_.format;
  this_local = (arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *)handle.custom_.value;
  if (this->ptr_ != (char *)0x0) {
    advance_to<char,fmt::v7::detail::error_handler>(this->parse_ctx_,this->ptr_);
  }
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  handle::format((handle *)&this_local,this->parse_ctx_,this->ctx_);
  iVar1 = basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(this->ctx_);
  return (iterator)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }